

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v3::load_header(xr_ogf_v3 *this,xr_reader *r)

{
  byte bVar1;
  uint16_t uVar2;
  uint16_t unused;
  xr_reader *r_local;
  xr_ogf_v3 *this_local;
  
  bVar1 = xr_reader::r_u8(r);
  (this->super_xr_ogf).m_version = (uint)bVar1;
  bVar1 = xr_reader::r_u8(r);
  (this->super_xr_ogf).m_model_type = (uint)bVar1;
  uVar2 = xr_reader::r_u16(r);
  this->m_texture_l = (uint)uVar2;
  this->m_shader_l = (uint)uVar2;
  xr_ogf::set_chunk_loaded(&this->super_xr_ogf,1);
  return;
}

Assistant:

void xr_ogf_v3::load_header(xr_reader& r)
{
	m_version = static_cast<ogf_version>(r.r_u8());
	m_model_type = static_cast<ogf_model_type>(r.r_u8());
	uint16_t unused = r.r_u16();
	m_texture_l = unused;
	m_shader_l = unused;
	set_chunk_loaded(OGF_HEADER);
}